

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  ushort uVar1;
  int iVar2;
  uint32_t *puVar3;
  int64_t *piVar4;
  CostInterval *pCVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  CostCacheInterval *cur;
  ushort *ptr;
  uint32_t *output;
  CostManager *manager;
  VP8LHistogram *p;
  CostCacheInterval *pCVar9;
  ulong *puVar10;
  ushort *puVar11;
  ulong uVar12;
  CostInterval *pCVar13;
  CostInterval *pCVar14;
  uint uVar15;
  int iVar16;
  CostInterval *pCVar17;
  uint uVar18;
  uint32_t uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  uint uVar24;
  CostManager *pCVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint64_t nmemb;
  uint uVar29;
  ushort *puVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  VP8LColorCache hashers;
  int local_bc;
  VP8LColorCache local_90;
  VP8LRefsCursor local_80;
  ulong local_68;
  uint64_t local_60;
  long local_58;
  VP8LBackwardRefs *local_50;
  VP8LHashChain *local_48;
  CostInterval *local_40;
  uint32_t *local_38;
  
  uVar29 = ysize * xsize;
  nmemb = (uint64_t)(int)uVar29;
  local_48 = hash_chain;
  ptr = (ushort *)WebPSafeMalloc(nmemb,2);
  if (ptr != (ushort *)0x0) {
    iVar8 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
    bVar6 = cache_bits < 1;
    if (cache_bits < 1) {
      iVar8 = 0x118;
    }
    local_50 = refs_src;
    output = (uint32_t *)WebPSafeCalloc(1,(long)iVar8 * 4 + 0xca8);
    manager = (CostManager *)WebPSafeCalloc(1,0x81c8);
    if (manager == (CostManager *)0x0 || output == (uint32_t *)0x0) {
LAB_0017c1fa:
      iVar8 = 0;
LAB_0017c5e5:
      bVar23 = true;
    }
    else {
      *(uint32_t **)(output + 0x328) = output + 0x32a;
      if (cache_bits < 1) {
        iVar8 = 0;
      }
      else {
        iVar8 = VP8LColorCacheInit(&local_90,cache_bits);
        if (iVar8 == 0) goto LAB_0017c1fa;
      }
      VP8LRefsCursorInit(&local_80,local_50);
      p = VP8LAllocateHistogram(cache_bits);
      if (p == (VP8LHistogram *)0x0) {
        VP8LFreeHistogram((VP8LHistogram *)0x0);
        goto LAB_0017c5e5;
      }
      local_60 = nmemb;
      VP8LHistogramInit(p,cache_bits,1);
      if (local_80.cur_pos != (PixOrCopy *)0x0) {
        do {
          VP8LHistogramAddSinglePixOrCopy(p,local_80.cur_pos,VP8LDistanceToPlaneCode,xsize);
          local_80.cur_pos = local_80.cur_pos + 1;
          if (local_80.cur_pos == local_80.last_pos_) {
            VP8LRefsCursorNextBlock(&local_80);
          }
        } while (local_80.cur_pos != (PixOrCopy *)0x0);
      }
      iVar16 = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
      if (p->palette_code_bits_ < 1) {
        iVar16 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar16,p->literal_,*(uint32_t **)(output + 0x328));
      ConvertPopulationCountTableToBitEstimates(0x100,p->red_,output + 0x100);
      ConvertPopulationCountTableToBitEstimates(0x100,p->blue_,output + 0x200);
      ConvertPopulationCountTableToBitEstimates(0x100,p->alpha_,output);
      local_38 = output + 0x300;
      ConvertPopulationCountTableToBitEstimates(0x28,p->distance_,local_38);
      VP8LFreeHistogram(p);
      nmemb = local_60;
      manager->costs_ = (int64_t *)0x0;
      manager->cache_intervals_ = (CostCacheInterval *)0x0;
      manager->head_ = (CostInterval *)0x0;
      manager->count_ = 0;
      manager->dist_array_ = ptr;
      manager->free_intervals_ = (CostInterval *)0x0;
      manager->recycled_intervals_ = (CostInterval *)0x0;
      pCVar13 = (CostInterval *)(manager->cost_cache_ + 0xffc);
      lVar20 = 10;
      pCVar17 = (CostInterval *)0x0;
      do {
        pCVar13[1].next_ = pCVar17;
        pCVar13 = pCVar13 + 1;
        lVar20 = lVar20 + -1;
        pCVar17 = pCVar13;
      } while (lVar20 != 0);
      uVar28 = 0xfff;
      if ((int)uVar29 < 0xfff) {
        uVar28 = (ulong)uVar29;
      }
      manager->free_intervals_ = pCVar13;
      if (0 < (int)uVar29) {
        lVar20 = *(long *)(output + 0x328);
        uVar21 = 0;
        do {
          if (uVar21 < 0x200) {
            uVar26 = (uint)kPrefixEncodeCode[uVar21].code_;
            uVar24 = (uint)kPrefixEncodeCode[uVar21].extra_bits_;
          }
          else {
            uVar18 = (int)uVar21 - 1;
            uVar26 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar24 = 0x1e - (uVar26 ^ 0x1f);
            uVar26 = (uint)((uVar18 >> (uVar24 & 0x1f) & 1) != 0) + (uVar26 ^ 0x1f) * 2 ^ 0x3e;
          }
          manager->cost_cache_[uVar21] =
               (long)(int)uVar24 * 0x800000 +
               (ulong)*(uint *)(lVar20 + 0x400 + (long)(int)uVar26 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar28 != uVar21);
      }
      manager->cache_intervals_size_ = 1;
      if (1 < (int)uVar29) {
        lVar20 = 0;
        do {
          if (manager->cost_cache_[lVar20 + 1] != manager->cost_cache_[lVar20]) {
            manager->cache_intervals_size_ = manager->cache_intervals_size_ + 1;
          }
          lVar20 = lVar20 + 1;
        } while (uVar28 - 1 != lVar20);
      }
      pCVar9 = (CostCacheInterval *)WebPSafeMalloc(manager->cache_intervals_size_,0x10);
      manager->cache_intervals_ = pCVar9;
      if (pCVar9 == (CostCacheInterval *)0x0) {
LAB_0017c5cf:
        CostManagerClear(manager);
        goto LAB_0017c5e5;
      }
      pCVar9->start_ = 0;
      pCVar9->end_ = 1;
      pCVar9->cost_ = manager->cost_cache_[0];
      if (1 < (int)uVar29) {
        lVar20 = 0;
        do {
          lVar22 = manager->cost_cache_[lVar20 + 1];
          if (lVar22 != pCVar9->cost_) {
            pCVar9[1].start_ = (int)lVar20 + 1;
            pCVar9[1].cost_ = lVar22;
            pCVar9 = pCVar9 + 1;
          }
          pCVar9->end_ = (int)lVar20 + 2;
          lVar20 = lVar20 + 1;
        } while (uVar28 - 1 != lVar20);
      }
      puVar10 = (ulong *)WebPSafeMalloc(nmemb,8);
      manager->costs_ = (int64_t *)puVar10;
      auVar7 = _DAT_0018ac60;
      if (puVar10 == (ulong *)0x0) goto LAB_0017c5cf;
      if (0 < (int)uVar29) {
        lVar20 = nmemb - 1;
        auVar31._8_4_ = (int)lVar20;
        auVar31._0_8_ = lVar20;
        auVar31._12_4_ = (int)((ulong)lVar20 >> 0x20);
        uVar28 = 0;
        auVar31 = auVar31 ^ _DAT_0018ac60;
        auVar32 = _DAT_00189a20;
        do {
          auVar33 = auVar32 ^ auVar7;
          if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                      auVar31._4_4_ < auVar33._4_4_) & 1)) {
            puVar10[uVar28] = 0x7fffffffffffffff;
          }
          if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
              auVar33._12_4_ <= auVar31._12_4_) {
            puVar10[uVar28 + 1] = 0x7fffffffffffffff;
          }
          uVar28 = uVar28 + 2;
          lVar20 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar20 + 2;
        } while ((uVar29 + 1 & 0xfffffffe) != uVar28);
      }
      *ptr = 0;
      uVar26 = *argb;
      if (cache_bits < 1) {
        uVar18 = 0xffffffff;
      }
      else {
        uVar18 = uVar26 * 0x1e35a7bd >> ((byte)local_90.hash_shift_ & 0x1f);
        if (local_90.colors_[(int)uVar18] != uVar26) {
          uVar18 = 0xffffffff;
        }
      }
      if ((int)uVar18 < 0) {
        if (0 < cache_bits) {
          local_90.colors_[(int)(uVar26 * 0x1e35a7bd >> ((byte)local_90.hash_shift_ & 0x1f))] =
               uVar26;
        }
        lVar20 = ((ulong)output[(ulong)(uVar26 & 0xff) + 0x200] +
                  (ulong)*(uint *)(*(long *)(output + 0x328) + (ulong)(uVar26 >> 8 & 0xff) * 4) +
                 (ulong)*(uint *)((long)output + (ulong)(uVar26 >> 0xe & 0x3fc) + 0x400) +
                 (ulong)output[uVar26 >> 0x18]) * 0x52;
      }
      else {
        lVar20 = (ulong)*(uint *)(*(long *)(output + 0x328) + (long)(int)(uVar18 + 0x118) * 4) *
                 0x44;
      }
      uVar28 = (lVar20 + 0x32U) / 100;
      if ((long)uVar28 < (long)*puVar10) {
        *puVar10 = uVar28;
        *ptr = 1;
      }
      if (1 < (int)uVar29) {
        pCVar13 = manager->intervals_ + 9;
        local_58 = -1;
        local_68 = 0;
        uVar28 = 1;
        local_bc = -1;
        uVar29 = 0xffffffff;
        uVar26 = 0xffffffff;
        local_40 = pCVar13;
        do {
          uVar18 = argb[uVar28];
          uVar24 = 0xffffffff;
          if ((0 < cache_bits) &&
             (uVar24 = uVar18 * 0x1e35a7bd >> ((byte)local_90.hash_shift_ & 0x1f),
             local_90.colors_[(int)uVar24] != uVar18)) {
            uVar24 = 0xffffffff;
          }
          puVar3 = local_48->offset_length_;
          uVar27 = puVar3[uVar28];
          piVar4 = manager->costs_;
          lVar20 = piVar4[uVar28 - 1];
          if ((int)uVar24 < 0) {
            if (0 < cache_bits) {
              local_90.colors_[(int)(uVar18 * 0x1e35a7bd >> ((byte)local_90.hash_shift_ & 0x1f))] =
                   uVar18;
            }
            lVar22 = ((ulong)output[(ulong)(uVar18 & 0xff) + 0x200] +
                      (ulong)*(uint *)(*(long *)(output + 0x328) + (ulong)(uVar18 >> 8 & 0xff) * 4)
                     + (ulong)*(uint *)((long)output + (ulong)(uVar18 >> 0xe & 0x3fc) + 0x400) +
                       (ulong)output[uVar18 >> 0x18]) * 0x52;
          }
          else {
            lVar22 = (ulong)*(uint *)(*(long *)(output + 0x328) + (long)(int)(uVar24 + 0x118) * 4) *
                     0x44;
          }
          lVar22 = (lVar22 + 0x32U) / 100 + lVar20;
          if (lVar22 < piVar4[uVar28]) {
            piVar4[uVar28] = lVar22;
            ptr[uVar28] = 1;
          }
          uVar24 = uVar27 >> 0xc;
          uVar27 = uVar27 & 0xfff;
          uVar18 = (uint)uVar28;
          uVar21 = local_68;
          if (1 < uVar27) {
            if (uVar24 == uVar29) {
              uVar21 = local_68 & 0xffffffff;
              if (local_bc != 0) {
                uVar21 = (ulong)((uVar18 - 2) + uVar26);
              }
              local_bc = 0;
              iVar16 = (int)uVar21;
              if (iVar16 < (int)(uVar18 + uVar27 + -1)) {
                uVar29 = 0;
                uVar21 = uVar28;
                if ((long)uVar28 <= (long)iVar16) {
                  do {
                    lVar20 = uVar21 + 1;
                    if (puVar3[lVar20] >> 0xc != uVar24) {
                      uVar29 = puVar3[uVar21 & 0xffffffff] & 0xfff;
                      uVar18 = (uint)uVar21;
                      goto LAB_0017cb42;
                    }
                    bVar23 = (long)uVar21 < (long)iVar16;
                    uVar21 = uVar21 + 1;
                  } while (bVar23);
                  uVar29 = puVar3[lVar20] & 0xfff;
                  uVar18 = iVar16 + 1;
                }
LAB_0017cb42:
                iVar16 = uVar18 - 1;
                pCVar13 = manager->head_;
                pCVar17 = pCVar13;
                if (pCVar13 != (CostInterval *)0x0) {
                  do {
                    if ((int)uVar18 <= pCVar17->start_) break;
                    pCVar14 = pCVar17->next_;
                    if (((int)uVar18 <= pCVar17->end_) && (pCVar17->cost_ < piVar4[iVar16])) {
                      iVar2 = pCVar17->index_;
                      piVar4[iVar16] = pCVar17->cost_;
                      manager->dist_array_[iVar16] = ((short)iVar16 - (short)iVar2) + 1;
                    }
                    pCVar17 = pCVar14;
                  } while (pCVar14 != (CostInterval *)0x0);
                  do {
                    if ((int)uVar18 < pCVar13->start_) break;
                    pCVar17 = pCVar13->next_;
                    if (((int)uVar18 < pCVar13->end_) && (pCVar13->cost_ < piVar4[uVar18])) {
                      iVar2 = pCVar13->index_;
                      piVar4[uVar18] = pCVar13->cost_;
                      manager->dist_array_[uVar18] = ((short)uVar18 - (short)iVar2) + 1;
                    }
                    pCVar13 = pCVar17;
                  } while (pCVar17 != (CostInterval *)0x0);
                }
                PushInterval(manager,piVar4[iVar16] + local_58,uVar18,uVar29);
                local_bc = 0;
                pCVar13 = local_40;
                uVar21 = (ulong)(iVar16 + uVar29);
              }
            }
            else {
              iVar16 = VP8LDistanceToPlaneCode(xsize,uVar24);
              if (iVar16 < 0x200) {
                uVar29 = (uint)kPrefixEncodeCode[iVar16].code_;
                uVar15 = (uint)kPrefixEncodeCode[iVar16].extra_bits_;
              }
              else {
                uVar26 = iVar16 - 1;
                uVar29 = 0x1f;
                if (uVar26 != 0) {
                  for (; uVar26 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                  }
                }
                uVar15 = 0x1e - (uVar29 ^ 0x1f);
                uVar29 = (uint)((uVar26 >> (uVar15 & 0x1f) & 1) != 0) + (uVar29 ^ 0x1f) * 2 ^ 0x3e;
              }
              local_58 = (long)(int)uVar15 * 0x800000 + (ulong)local_38[(int)uVar29];
              PushInterval(manager,lVar20 + local_58,uVar18,uVar27);
              local_bc = 1;
              uVar21 = local_68;
            }
          }
          local_68 = uVar21;
          pCVar17 = manager->head_;
          while ((pCVar14 = pCVar17, pCVar14 != (CostInterval *)0x0 &&
                 ((long)pCVar14->start_ <= (long)uVar28))) {
            pCVar17 = pCVar14->next_;
            if ((long)uVar28 < (long)pCVar14->end_) {
              if (pCVar14->cost_ < manager->costs_[uVar28]) {
                iVar16 = pCVar14->index_;
                manager->costs_[uVar28] = pCVar14->cost_;
                manager->dist_array_[uVar28] = ((short)uVar28 - (short)iVar16) + 1;
              }
            }
            else {
              pCVar5 = pCVar14->previous_;
              pCVar25 = (CostManager *)&pCVar5->next_;
              if (pCVar5 == (CostInterval *)0x0) {
                pCVar25 = manager;
              }
              pCVar25->head_ = pCVar17;
              if (pCVar17 != (CostInterval *)0x0) {
                pCVar17->previous_ = pCVar5;
              }
              bVar23 = pCVar13 < pCVar14 || pCVar14 < manager->intervals_;
              pCVar14->next_ = (&manager->free_intervals_)[bVar23];
              (&manager->free_intervals_)[bVar23] = pCVar14;
              manager->count_ = manager->count_ + -1;
            }
          }
          uVar28 = uVar28 + 1;
          uVar29 = uVar24;
          uVar26 = uVar27;
        } while (uVar28 != local_60);
      }
      bVar23 = local_50->error_ != 0;
      nmemb = local_60;
    }
    if (iVar8 != 0) {
      VP8LColorCacheClear(&local_90);
    }
    CostManagerClear(manager);
    WebPSafeFree(output);
    WebPSafeFree(manager);
    if (!bVar23) {
      puVar30 = ptr + nmemb;
      for (puVar11 = ptr + (nmemb - 1); ptr <= puVar11;
          puVar11 = (ushort *)((long)puVar11 - (ulong)((uint)uVar1 * 2))) {
        uVar1 = *puVar11;
        puVar30[-1] = uVar1;
        puVar30 = puVar30 + -1;
      }
      if ((cache_bits < 1) ||
         (iVar8 = VP8LColorCacheInit((VP8LColorCache *)&local_80,cache_bits), iVar8 != 0)) {
        VP8LClearBackwardRefs(refs_dst);
        uVar29 = (uint)((ulong)((long)(ptr + nmemb) - (long)puVar30) >> 1);
        if (0 < (int)uVar29) {
          uVar28 = 0;
          uVar21 = 0;
          do {
            uVar1 = puVar30[uVar28];
            uVar26 = (uint)uVar1;
            if ((ulong)uVar1 == 1) {
              if (cache_bits < 1) {
                uVar19 = 0xffffffff;
              }
              else {
                uVar19 = argb[uVar21] * 0x1e35a7bd >> ((byte)local_80.cur_block_ & 0x1f);
                if (*(uint32_t *)(&(local_80.cur_pos)->mode + (long)(int)uVar19 * 4) != argb[uVar21]
                   ) {
                  uVar19 = 0xffffffff;
                }
              }
              uVar12 = 0x10001;
              if ((int)uVar19 < 0) {
                if (0 < cache_bits) {
                  *(uint32_t *)
                   (&(local_80.cur_pos)->mode +
                   (long)(int)(argb[uVar21] * 0x1e35a7bd >> ((byte)local_80.cur_block_ & 0x1f)) * 4)
                       = argb[uVar21];
                }
                uVar19 = argb[uVar21];
                uVar12 = 0x10000;
              }
              VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar19 << 0x20 | uVar12));
              uVar26 = 1;
            }
            else {
              VP8LBackwardRefsCursorAdd
                        (refs_dst,(PixOrCopy)
                                  (((ulong)(local_48->offset_length_[uVar21] >> 0xc) << 0x20) +
                                   (ulong)uVar1 * 0x10000 + 2));
              if ((0 < cache_bits) && (uVar1 != 0)) {
                uVar12 = 0;
                do {
                  *(uint32_t *)
                   (&(local_80.cur_pos)->mode +
                   (long)(int)(argb[uVar21 + uVar12] * 0x1e35a7bd >>
                              ((byte)local_80.cur_block_ & 0x1f)) * 4) = argb[uVar21 + uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar1 != uVar12);
              }
            }
            uVar21 = (ulong)((int)uVar21 + uVar26);
            uVar28 = uVar28 + 1;
          } while (uVar28 != (uVar29 & 0x7fffffff));
        }
        uVar29 = (uint)(refs_dst->error_ == 0);
      }
      else {
        uVar29 = 0;
        bVar6 = true;
      }
      if (!bVar6) {
        VP8LColorCacheClear((VP8LColorCache *)&local_80);
      }
      goto LAB_0017c615;
    }
  }
  uVar29 = 0;
LAB_0017c615:
  WebPSafeFree(ptr);
  return uVar29;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}